

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drawing.cpp
# Opt level: O2

void QtMWidgets::drawSliderHandle
               (QPainter *p,QRect *r,int xRadius,int yRadius,QColor *borderColor,QColor *lightColor)

{
  QColor QVar1;
  QRect local_a8;
  qreal local_98;
  qreal qStack_90;
  QLinearGradient g;
  
  QPainter::setPen((QColor *)p);
  QBrush::QBrush((QBrush *)&g,lightColor,SolidPattern);
  QPainter::setBrush((QBrush *)p);
  QBrush::~QBrush((QBrush *)&g);
  QPainter::drawRoundedRect(p,r,(double)xRadius,(double)yRadius,AbsoluteSize);
  local_a8 = (QRect)ZEXT816(0);
  local_98 = 0.0;
  qStack_90 = 1.0;
  QLinearGradient::QLinearGradient(&g,(QPointF *)&local_a8,(QPointF *)&local_98);
  QGradient::setCoordinateMode((CoordinateMode)&g);
  QVar1 = darkerColor(lightColor,0x4b);
  local_a8._0_14_ = QVar1._0_14_;
  QGradient::setColorAt(0.0,(QColor *)&g);
  QVar1 = darkerColor(lightColor,10);
  local_a8._0_14_ = QVar1._0_14_;
  QGradient::setColorAt(1.0,(QColor *)&g);
  QPainter::setPen((PenStyle)p);
  QBrush::QBrush((QBrush *)&local_a8,(QGradient *)&g);
  QPainter::setBrush((QBrush *)p);
  QBrush::~QBrush((QBrush *)&local_a8);
  local_98 = 4.24399158291868e-314;
  qStack_90 = 4.24399158291868e-314;
  local_a8 = QRect::marginsRemoved(r,(QMargins *)&local_98);
  QPainter::drawRoundedRect(p,&local_a8,(double)(xRadius + -4),(double)(yRadius + -4),AbsoluteSize);
  QLinearGradient::~QLinearGradient(&g);
  return;
}

Assistant:

void drawSliderHandle( QPainter * p, const QRect & r,
	int xRadius, int yRadius, const QColor & borderColor,
	const QColor & lightColor )
{
	p->setPen( borderColor );
	p->setBrush( lightColor );
	p->drawRoundedRect( r, xRadius, yRadius );

	QLinearGradient g( QPointF( 0.0, 0.0 ), QPointF( 0.0, 1.0 ) );
	g.setCoordinateMode( QGradient::ObjectBoundingMode );
	g.setColorAt( 0.0, darkerColor( lightColor, 75 ) );
	g.setColorAt( 1.0, darkerColor( lightColor, 10 ) );

	p->setPen( Qt::NoPen );
	p->setBrush( g );

	p->drawRoundedRect( r.marginsRemoved( QMargins( 2, 2, 2, 2 ) ),
		xRadius - 4, yRadius - 4 );
}